

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void sect_NewSection(char *name,SectionType type,uint32_t org,SectionSpec *attribs,
                    SectionModifier mod)

{
  int iVar1;
  Section *pSVar2;
  uint32_t local_3c;
  Section *sect;
  SectionStackEntry *stack;
  SectionModifier mod_local;
  SectionSpec *attribs_local;
  uint32_t org_local;
  SectionType type_local;
  char *name_local;
  
  if (currentLoadSection != (Section *)0x0) {
    fatalerror("Cannot change the section within a `LOAD` block\n");
  }
  sect = (Section *)sectionStack;
  do {
    if (sect == (Section *)0x0) {
      pSVar2 = getSection(name,type,org,attribs,mod);
      changeSection();
      if (mod == SECTION_UNION) {
        local_3c = 0;
      }
      else {
        local_3c = pSVar2->size;
      }
      curOffset = local_3c;
      loadOffset = 0;
      currentSection = pSVar2;
      return;
    }
    if (sect->name != (char *)0x0) {
      iVar1 = strcmp(name,*(char **)sect->name);
      if (iVar1 == 0) {
        fatalerror("Section \'%s\' is already on the stack\n",name);
      }
    }
    sect = *(Section **)&sect->align;
  } while( true );
}

Assistant:

void sect_NewSection(char const *name, enum SectionType type, uint32_t org,
		     struct SectionSpec const *attribs, enum SectionModifier mod)
{
	if (currentLoadSection)
		fatalerror("Cannot change the section within a `LOAD` block\n");

	for (struct SectionStackEntry *stack = sectionStack; stack; stack = stack->next) {
		if (stack->section && !strcmp(name, stack->section->name))
			fatalerror("Section '%s' is already on the stack\n", name);
	}

	struct Section *sect = getSection(name, type, org, attribs, mod);

	changeSection();
	curOffset = mod == SECTION_UNION ? 0 : sect->size;
	loadOffset = 0; // This is still used when checking for section size overflow!
	currentSection = sect;
}